

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ld(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i64 EA_00;
  bool bVar3;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    bVar3 = true;
    if (uVar1 != 0) {
      uVar1 = rA(ctx->opcode);
      uVar2 = rD(ctx->opcode);
      bVar3 = uVar1 == uVar2;
    }
    if (bVar3) {
      gen_inval_exception(ctx,1);
      return;
    }
  }
  gen_set_access_type(ctx,0x20);
  EA_00 = tcg_temp_new_i64(tcg_ctx_00);
  gen_addr_imm_index(ctx,EA_00,3);
  if ((ctx->opcode & 2) == 0) {
    uVar1 = rD(ctx->opcode);
    gen_qemu_ld64_i64(ctx,cpu_gpr[uVar1],EA_00);
  }
  else {
    uVar1 = rD(ctx->opcode);
    gen_qemu_ld32s(ctx,cpu_gpr[uVar1],EA_00);
  }
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],EA_00);
  }
  tcg_temp_free_i64(tcg_ctx_00,EA_00);
  return;
}

Assistant:

static void gen_ld(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    if (Rc(ctx->opcode)) {
        if (unlikely(rA(ctx->opcode) == 0 ||
                     rA(ctx->opcode) == rD(ctx->opcode))) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
            return;
        }
    }
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_imm_index(ctx, EA, 0x03);
    if (ctx->opcode & 0x02) {
        /* lwa (lwau is undefined) */
        gen_qemu_ld32s(ctx, cpu_gpr[rD(ctx->opcode)], EA);
    } else {
        /* ld - ldu */
        gen_qemu_ld64_i64(ctx, cpu_gpr[rD(ctx->opcode)], EA);
    }
    if (Rc(ctx->opcode)) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], EA);
    }
    tcg_temp_free(tcg_ctx, EA);
}